

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall xemmai::t_object::f_cyclic_decrement(t_object *this)

{
  t_object *ptVar1;
  t_object *this_local;
  
  f_scan_fields(this,f_push<&xemmai::t_object::f_cyclic_decrement_push>);
  if (this->v_type->f_finalize != (_func_void_t_object_ptr_t_scan *)0x0) {
    (*this->v_type->f_finalize)(this,f_push<&xemmai::t_object::f_cyclic_decrement_push>);
  }
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_type->v_this);
  if (ptVar1 != (t_object *)0x0) {
    ptVar1 = t_slot::operator->(&this->v_type->v_this);
    f_cyclic_decrement_push(ptVar1);
  }
  this->v_type = (t_type *)0x0;
  return;
}

Assistant:

void f_cyclic_decrement()
	{
		f_scan_fields(f_push<&t_object::f_cyclic_decrement_push>);
		if (v_type->f_finalize) v_type->f_finalize(this, f_push<&t_object::f_cyclic_decrement_push>);
		if (v_type->v_this) v_type->v_this->f_cyclic_decrement_push();
		v_type = nullptr;
	}